

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  initializer_list<int> local_34c8;
  double local_34b8 [2];
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_34a8;
  
  dumpinfo<multidim::MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&local_34a8,"byrow(2,2,3,4)");
  local_34c8._M_array =
       (iterator)
       ((long)local_34a8.data_.super_PlainObjectBase<Eigen::Matrix<double,_1680,_1,_0,_1680,_1>_>.
              m_storage.m_data.array + 0x1500);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"byrow(2,2,3,4) fix dim 0 at index 2");
  local_34c8._M_array =
       (iterator)
       ((long)local_34a8.data_.super_PlainObjectBase<Eigen::Matrix<double,_1680,_1,_0,_1680,_1>_>.
              m_storage.m_data.array + 0x80);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"byrow(2,2,3,4) fix dim 2 at index 2");
  local_34c8._M_array =
       (iterator)
       ((long)local_34a8.data_.super_PlainObjectBase<Eigen::Matrix<double,_1680,_1,_0,_1680,_1>_>.
              m_storage.m_data.array + 0x10);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>_>_>
              *)&local_34c8,"byrow(2,2,3,4) fix dim 3 at index 2");
  dumpinfo<multidim::MultiDimN<double,multidim::type_sequence<multidim::sspair<1,1>,multidim::sspair<2,1>,multidim::sspair<3,2>,multidim::sspair<4,6>>>>
            ((MultiDimN<double,_multidim::type_sequence<multidim::sspair<1,_1>,_multidim::sspair<2,_1>,_multidim::sspair<3,_2>,_multidim::sspair<4,_6>_>_>
              *)&local_34a8,"bycol(2,2,3,4)");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<3,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<3,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"getblock0");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"getblock1");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<3,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<3,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"getblock2");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<1,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<1,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"getblock0 non squeezed");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
              *)&local_34c8,"getblock0 squeezed");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<8,1>,multidim::sspair<7,8>,multidim::sspair<6,56>,multidim::sspair<5,336>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<8,_1>,_multidim::sspair<7,_8>,_multidim::sspair<6,_56>,_multidim::sspair<5,_336>_>_>
              *)&local_34c8,"flip byrow(4,3,2,2)");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,1>,multidim::sspair<3,5>,multidim::sspair<2,15>,multidim::sspair<7,30>,multidim::sspair<4,210>,multidim::sspair<2,840>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_1>,_multidim::sspair<3,_5>,_multidim::sspair<2,_15>,_multidim::sspair<7,_30>,_multidim::sspair<4,_210>,_multidim::sspair<2,_840>_>_>
              *)&local_34c8,"reshape col major(5,3,2,7,4,2)");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,112>,multidim::sspair<2,56>,multidim::sspair<7,8>,multidim::sspair<4,2>,multidim::sspair<2,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>_>
              *)&local_34c8,"reshape row major(5,3,2,7,4,2)");
  local_34c8._M_array = (iterator)&local_34a8;
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,112>,multidim::sspair<2,56>,multidim::sspair<7,8>,multidim::sspair<4,2>,multidim::sspair<2,1>>>>
            ((MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>_>
              *)&local_34c8,"reshape row major(5,3,2,7,4,2)");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"offset ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4a);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"offset ",7);
  local_34c8._M_array = (iterator)local_34b8;
  local_34b8[0] = 2.12199579096527e-314;
  local_34b8[1] = 4.24399158291868e-314;
  local_34c8._M_len = 4;
  iVar1 = multidim::
          MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
          ::offset((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
                    *)&local_34a8,&local_34c8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	using X = multidim::MultiDimNRow<double,5,6,7,8> ;
	using Y = multidim::MultiDimNCol<double,1,2,3,4> ;
	dumpinfo(X(),"byrow(2,2,3,4)");
	dumpinfo(X().limit1<0>(2),"byrow(2,2,3,4) fix dim 0 at index 2");
	dumpinfo(X().limit1<2>(2),"byrow(2,2,3,4) fix dim 2 at index 2");
	dumpinfo(X().limit1<3>(2),"byrow(2,2,3,4) fix dim 3 at index 2");
	// compile error dumpinfo(X().limit1<4>(2),"byrow(2,2,3,4) fix beyond");
	dumpinfo(Y(),"bycol(2,2,3,4)");

	dumpinfo(X().limit1block<0,3>(0),"getblock0");
	dumpinfo(X().limit1block<1,3>(0),"getblock1");
	dumpinfo(X().limit1block<2,3>(0),"getblock2"); // 2 2 1 4
	//BUG dumpinfo(X().limit1block<3,1>(1),"getblocklast");
	dumpinfo(X().limit1block<0,1>(0),"getblock0 non squeezed");
	dumpinfo(X().limit1block<0,1>(0).squeeze(),"getblock0 squeezed");
	
	X().limit1<2>(2).setZero();
	X().limit1<2>(2).setZero();
	X().setZero();

	dumpinfo(X().permutedim<3,2,1,0>(),"flip byrow(4,3,2,2)");
	
	dumpinfo(X().reshapeC<5,3,2,7,4,2>(),"reshape col major(5,3,2,7,4,2)");

	dumpinfo(X().reshapeR<5,3,2,7,4,2>(),"reshape row major(5,3,2,7,4,2)");

	dumpinfo(X().reshapeC<5,3,2,7,4,2>().reshapeR<5,3,2,7,4,2>(),"reshape row major(5,3,2,7,4,2)");
	
	// as static
	// as args
	// as initializer list
	// TBD as eigen
	std::cout << "offset " << X::offsetvalue<0,1,2,2>::value << std::endl;
	std::cout << "offset " << X().offset(0,1,2,2) << std::endl;
	//compiletime: std::cout << "offset " << X().offset(0,1,2,2,3) << std::endl;
	//runtime: std::cout << "offset " << X().offset({0,1,2,2,4}) << std::endl;

//	std::cout << "dimension 3 is " << x.getsize<3>() << std::endl;
//	std::cout << "dimension 3 is " << x.getsize(3) << std::endl;
	return 0;
}